

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VSetArrayPointer(N_Vector W,sunindextype param_2,int myid)

{
  int iVar1;
  void *__ptr;
  long lVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  if (W->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0) {
    printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d missing required operations\n",
           (ulong)(uint)myid);
  }
  else {
    __ptr = malloc(param_2 * 8);
    lVar2 = 0;
    if (param_2 < 1) {
      param_2 = lVar2;
    }
    for (; param_2 != lVar2; lVar2 = lVar2 + 1) {
      *(undefined8 *)((long)__ptr + lVar2 * 8) = 0x3ff0000000000000;
    }
    dVar4 = get_time();
    N_VSetArrayPointer(__ptr,W);
    dVar5 = get_time();
    N_VConst(0xbfe0000000000000,W);
    iVar3 = 0;
    for (lVar2 = 0; param_2 != lVar2; lVar2 = lVar2 + 1) {
      iVar1 = SUNRCompare(*(undefined8 *)((long)__ptr + lVar2 * 8),0xbfe0000000000000);
      iVar3 = iVar3 + iVar1;
    }
    if (iVar3 == 0) {
      free(__ptr);
      if (myid == 0) {
        puts("PASSED test -- N_VSetArrayPointer ");
      }
      max_time(W,dVar5 - dVar4);
      if (print_time == 0) {
        return 0;
      }
      printf("%s Time: %22.15e\n\n","N_VSetArrayPointer");
      return 0;
    }
    printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d \n",(ulong)(uint)myid);
    puts("    Failed N_VConst check \n");
    free(__ptr);
  }
  return 1;
}

Assistant:

int Test_N_VSetArrayPointer(N_Vector W, sunindextype local_length, int myid)
{
  int failure = 0;
  sunindextype i;
  double start_time, stop_time, maxt;
  sunrealtype* Wdata;

  /* check if the required operations are implemented */
  if (W->ops->nvconst == NULL)
  {
    printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d missing required "
           "operations\n",
           myid);
    return (1);
  }

  /* create vector data */
  Wdata = (sunrealtype*)malloc(local_length * sizeof(sunrealtype));
  for (i = 0; i < local_length; i++) { Wdata[i] = ONE; }

  /* attach data to vector */
  start_time = get_time();
  N_VSetArrayPointer(Wdata, W);
  stop_time = get_time();

  /* check vector data */
  N_VConst(NEG_HALF, W);
  for (i = 0; i < local_length; i++)
  {
    failure += SUNRCompare(Wdata[i], NEG_HALF);
  }

  if (failure)
  {
    printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d \n", myid);
    printf("    Failed N_VConst check \n\n");
    free(Wdata);
    return (1);
  }

  free(Wdata);

  if (myid == 0) { printf("PASSED test -- N_VSetArrayPointer \n"); }

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VSetArrayPointer", maxt);

  return (0);
}